

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

string * __thiscall
llvm::Triple::normalize_abi_cxx11_(string *__return_storage_ptr__,Triple *this,StringRef Str)

{
  undefined8 *puVar1;
  char *__s1;
  ulong __n;
  undefined8 uVar2;
  void *__s1_00;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  undefined1 uVar6;
  char *pcVar7;
  void *pvVar8;
  size_type sVar9;
  ArchType AVar10;
  OSType OVar11;
  ObjectFormatType OVar12;
  int iVar13;
  undefined8 uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  StringRef SVar25;
  StringRef SVar26;
  StringRef ArchName;
  StringRef OSName;
  StringRef EnvironmentName;
  StringRef VendorName;
  EnvironmentType local_120;
  bool Found [4];
  ObjectFormatType local_110;
  VendorType local_10c;
  SmallVector<llvm::StringRef,_4U> Components;
  StringRef CurrentComponent;
  StringRef AndroidVersion;
  string NormalizedEnvironment;
  StringRef Str_local;
  Twine local_48;
  
  Str_local.Length = (size_t)Str.Data;
  Components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       &Components.super_SmallVectorStorage<llvm::StringRef,_4U>;
  Components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  Components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 4;
  Str_local.Data = (char *)this;
  StringRef::split(&Str_local,&Components.super_SmallVectorImpl<llvm::StringRef>,'-',-1,true);
  if (Components.super_SmallVectorImpl<llvm::StringRef>.
      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 0) {
    bVar22 = false;
LAB_001866e1:
    local_120 = UnknownEnvironment;
    local_10c = UnknownVendor;
    OVar11 = UnknownOS;
    bVar23 = false;
    bVar24 = false;
    local_110 = UnknownObjectFormat;
  }
  else {
    AVar10 = parseArch(*Components.super_SmallVectorImpl<llvm::StringRef>.
                        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase
                        .BeginX);
    bVar22 = AVar10 != UnknownArch;
    if (Components.super_SmallVectorImpl<llvm::StringRef>.
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 2)
    goto LAB_001866e1;
    local_10c = parseVendor(*(StringRef *)
                             ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                    super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                    super_SmallVectorBase.BeginX + 0x10));
    if (Components.super_SmallVectorImpl<llvm::StringRef>.
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 3) {
      local_110 = UnknownObjectFormat;
      local_120 = UnknownEnvironment;
      OVar11 = UnknownOS;
      bVar23 = false;
      bVar24 = false;
    }
    else {
      local_110 = UnknownObjectFormat;
      OVar11 = parseOS(*(StringRef *)
                        ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                               super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                               super_SmallVectorBase.BeginX + 0x20));
      pvVar8 = Components.super_SmallVectorImpl<llvm::StringRef>.
               super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
      uVar20 = Components.super_SmallVectorImpl<llvm::StringRef>.
               super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
      if (Components.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 3)
      goto LAB_00186e63;
      if (*(ulong *)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                           super_SmallVectorBase.BeginX + 0x28) < 6) {
        bVar23 = false;
        bVar24 = false;
        if (*(ulong *)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                             super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                             super_SmallVectorBase.BeginX + 0x28) == 5) goto LAB_00186ddf;
      }
      else {
        iVar13 = bcmp(*(void **)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                       super_SmallVectorBase.BeginX + 0x20),"cygwin",6);
        bVar23 = iVar13 == 0;
LAB_00186ddf:
        iVar13 = bcmp(*(void **)((long)pvVar8 + 0x20),"mingw",5);
        bVar24 = iVar13 == 0;
      }
      if (uVar20 == 3) {
        local_120 = UnknownEnvironment;
      }
      else {
        local_120 = parseEnvironment(*(StringRef *)
                                      ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                             super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                             super_SmallVectorBase.BeginX + 0x30));
        if (4 < Components.super_SmallVectorImpl<llvm::StringRef>.
                super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
          local_110 = parseFormat(*(StringRef *)
                                   ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                          super_SmallVectorBase.BeginX + 0x40));
        }
      }
    }
  }
  Found[0] = bVar22;
  Found[1] = local_10c != UnknownVendor;
  Found[2] = OVar11 != UnknownOS;
  Found[3] = local_120 != UnknownEnvironment;
  uVar19 = 0;
LAB_0018671d:
  pvVar8 = Components.super_SmallVectorImpl<llvm::StringRef>.
           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
  if (uVar19 != 4) {
    if (Found[uVar19] == false) {
      lVar18 = 8;
      uVar21 = 0;
      while( true ) {
        uVar20 = (uint)uVar21;
        if (uVar20 == Components.super_SmallVectorImpl<llvm::StringRef>.
                      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                      Size) break;
        if ((3 < uVar20) || (Found[uVar21] == false)) {
          if (Components.super_SmallVectorImpl<llvm::StringRef>.
              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size <=
              uVar20) goto LAB_00186e63;
          if (3 < (uint)uVar19) {
            llvm_unreachable_internal
                      ("unexpected component type!",
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                       ,0x329);
          }
          __s1 = *(char **)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                  super_SmallVectorBase.BeginX + lVar18 + -8);
          __n = *(ulong *)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                 super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                 super_SmallVectorBase.BeginX + lVar18);
          switch(uVar19 & 0xffffffff) {
          case 0:
            ArchName.Length = __n;
            ArchName.Data = __s1;
            AVar10 = parseArch(ArchName);
            if (AVar10 == UnknownArch) goto LAB_00186889;
            break;
          case 1:
            VendorName.Length = __n;
            VendorName.Data = __s1;
            local_10c = parseVendor(VendorName);
            if (local_10c == UnknownVendor) {
              local_10c = UnknownVendor;
              goto LAB_00186889;
            }
            break;
          case 2:
            OSName.Length = __n;
            OSName.Data = __s1;
            OVar11 = parseOS(OSName);
            if (__n < 6) {
              bVar23 = false;
              bVar24 = false;
              if (__n == 5) goto LAB_00186855;
            }
            else {
              iVar13 = bcmp(__s1,"cygwin",6);
              bVar23 = iVar13 == 0;
LAB_00186855:
              iVar13 = bcmp(__s1,"mingw",5);
              bVar24 = iVar13 == 0;
            }
            if (((OVar11 == UnknownOS) && (!bVar23)) && (!bVar24)) {
              OVar11 = UnknownOS;
              goto LAB_00186889;
            }
            break;
          case 3:
            SVar26.Length = __n;
            SVar26.Data = __s1;
            local_120 = parseEnvironment(SVar26);
            if (local_120 == UnknownEnvironment) {
              EnvironmentName.Length = __n;
              EnvironmentName.Data = __s1;
              OVar12 = parseFormat(EnvironmentName);
              local_110 = UnknownObjectFormat;
              if (OVar12 == UnknownObjectFormat) {
                local_120 = UnknownEnvironment;
                goto LAB_00186889;
              }
              local_120 = UnknownEnvironment;
              local_110 = OVar12;
            }
          }
          pcVar4 = AndroidVersion.Data;
          sVar5 = AndroidVersion.Length;
          uVar6 = NormalizedEnvironment.field_2._M_local_buf[0];
          pcVar7 = Str_local.Data;
          sVar3 = Str_local.Length;
          uVar17 = uVar21;
          if (uVar21 <= uVar19) goto joined_r0x00186956;
          if (Components.super_SmallVectorImpl<llvm::StringRef>.
              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size <=
              uVar20) goto LAB_00186e63;
          uVar14 = *(undefined8 *)
                    ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                           super_SmallVectorBase.BeginX + lVar18 + -8);
          lVar16 = *(long *)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                   super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                   super_SmallVectorBase.BeginX + lVar18);
          *(char **)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                           super_SmallVectorBase.BeginX + lVar18 + -8) = "";
          *(undefined8 *)
           ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                  BeginX + lVar18) = 0;
          uVar21 = uVar19 & 0xffffffff;
          goto LAB_001868ec;
        }
LAB_00186889:
        uVar21 = uVar21 + 1;
        lVar18 = lVar18 + 0x10;
      }
    }
    goto LAB_00186a4e;
  }
  NormalizedEnvironment._M_dataplus._M_p = (pointer)&NormalizedEnvironment.field_2;
  NormalizedEnvironment._M_string_length = 0;
  NormalizedEnvironment.field_2._M_local_buf[0] = '\0';
  if (local_120 == Android) {
    if (Components.super_SmallVectorImpl<llvm::StringRef>.
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 4)
    goto LAB_00186e63;
    uVar19 = *(ulong *)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                              super_SmallVectorBase.BeginX + 0x38);
    if (10 < uVar19) {
      __s1_00 = *(void **)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                 super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                 super_SmallVectorBase.BeginX + 0x30);
      iVar13 = bcmp(__s1_00,"androideabi",0xb);
      if (iVar13 == 0) {
        AndroidVersion.Data = (char *)((long)__s1_00 + 0xb);
        AndroidVersion.Length = uVar19 - 0xb;
        if (AndroidVersion.Length == 0) {
          *(char **)((long)pvVar8 + 0x30) = "android";
          *(undefined8 *)((long)pvVar8 + 0x38) = 7;
        }
        else {
          Twine::Twine(&local_48,"android",&AndroidVersion);
          Twine::str_abi_cxx11_((string *)&CurrentComponent,&local_48);
          std::__cxx11::string::operator=
                    ((string *)&NormalizedEnvironment,(string *)&CurrentComponent);
          std::__cxx11::string::_M_dispose();
          sVar9 = NormalizedEnvironment._M_string_length;
          if (Components.super_SmallVectorImpl<llvm::StringRef>.
              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 4)
          goto LAB_00186e63;
          *(pointer *)
           ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                  BeginX + 0x30) = NormalizedEnvironment._M_dataplus._M_p;
          *(size_type *)
           ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                  BeginX + 0x38) = sVar9;
        }
      }
    }
  }
  else if ((local_10c == SUSE) && (local_120 == GNUEABI)) {
    if (Components.super_SmallVectorImpl<llvm::StringRef>.
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 4)
    goto LAB_00186e63;
    *(char **)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                     super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     BeginX + 0x30) = "gnueabihf";
    *(undefined8 *)
     ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
     0x38) = 9;
  }
  if (OVar11 == Win32) {
    SmallVectorImpl<llvm::StringRef>::resize(&Components.super_SmallVectorImpl<llvm::StringRef>,4);
    if (Components.super_SmallVectorImpl<llvm::StringRef>.
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 3)
    goto LAB_00186e63;
    *(char **)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                     super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     BeginX + 0x20) = "windows";
    *(undefined8 *)
     ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
     0x28) = 7;
    if (local_120 == UnknownEnvironment) {
      if (local_110 < ELF) {
        if (Components.super_SmallVectorImpl<llvm::StringRef>.
            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 3)
        goto LAB_00186e63;
        SVar25.Length = 4;
        SVar25.Data = "msvc";
      }
      else {
        SVar25 = getObjectFormatTypeName(local_110);
        if (Components.super_SmallVectorImpl<llvm::StringRef>.
            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 4)
        goto LAB_00186e63;
      }
      goto LAB_00186ccf;
    }
  }
  else {
    if (bVar24) {
      SmallVectorImpl<llvm::StringRef>::resize(&Components.super_SmallVectorImpl<llvm::StringRef>,4)
      ;
      if (Components.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 3)
      goto LAB_00186e63;
      *(char **)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                       BeginX + 0x20) = "windows";
      *(undefined8 *)
       ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
       0x28) = 7;
      if (Components.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 3)
      goto LAB_00186e63;
      SVar25.Length = 3;
      SVar25.Data = "gnu";
    }
    else {
      if (!bVar23) goto LAB_00186cd7;
      SmallVectorImpl<llvm::StringRef>::resize(&Components.super_SmallVectorImpl<llvm::StringRef>,4)
      ;
      if (Components.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 3)
      goto LAB_00186e63;
      *(char **)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                       BeginX + 0x20) = "windows";
      *(undefined8 *)
       ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
       0x28) = 7;
      if (Components.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 3)
      goto LAB_00186e63;
      SVar25.Length = 6;
      SVar25.Data = "cygnus";
    }
LAB_00186ccf:
    *(StringRef *)
     ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
     0x30) = SVar25;
  }
LAB_00186cd7:
  if (((bVar24) || (bVar23 || local_120 != UnknownEnvironment && OVar11 == Win32)) &&
     (COFF < local_110)) {
    SmallVectorImpl<llvm::StringRef>::resize(&Components.super_SmallVectorImpl<llvm::StringRef>,5);
    SVar26 = getObjectFormatTypeName(local_110);
    if (Components.super_SmallVectorImpl<llvm::StringRef>.
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 5)
    goto LAB_00186e63;
    *(StringRef *)
     ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
     0x40) = SVar26;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar21 = Components.super_SmallVectorImpl<llvm::StringRef>.
           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
           0xffffffff;
  lVar18 = 8;
  uVar19 = 0;
  while( true ) {
    if (uVar21 == uVar19) {
      std::__cxx11::string::_M_dispose();
      SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl
                (&Components.super_SmallVectorImpl<llvm::StringRef>);
      return __return_storage_ptr__;
    }
    if (uVar19 != 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    if ((Components.super_SmallVectorImpl<llvm::StringRef>.
         super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
        0xffffffff) <= uVar19) break;
    std::__cxx11::string::append
              ((char *)__return_storage_ptr__,
               *(ulong *)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar18 + -8));
    uVar19 = uVar19 + 1;
    lVar18 = lVar18 + 0x10;
  }
LAB_00186e63:
  __assert_fail("idx < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x9b,
                "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
               );
joined_r0x00186956:
  while (AndroidVersion.Data = pcVar4, AndroidVersion.Length = sVar5,
        NormalizedEnvironment.field_2._M_local_buf[0] = uVar6, Str_local.Data = pcVar7,
        Str_local.Length = sVar3, uVar17 < uVar19) {
    CurrentComponent.Data = "";
    CurrentComponent.Length = 0;
    bVar22 = true;
    uVar17 = uVar21 & 0xffffffff;
    while (sVar5 = CurrentComponent.Length, pcVar4 = CurrentComponent.Data,
          (uint)uVar17 <
          Components.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
      NormalizedEnvironment._M_dataplus._M_p = CurrentComponent.Data;
      NormalizedEnvironment._M_string_length = CurrentComponent.Length;
      puVar1 = (undefined8 *)
               ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                      BeginX + uVar17 * 0x10);
      sVar3 = puVar1[1];
      CurrentComponent.Data = (char *)*puVar1;
      CurrentComponent.Length = sVar3;
      puVar1 = (undefined8 *)
               ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                      BeginX + uVar17 * 0x10);
      *puVar1 = pcVar4;
      puVar1[1] = sVar5;
      if (sVar3 == 0) goto LAB_001869e2;
      do {
        uVar15 = uVar17;
        if (2 < uVar15) break;
        uVar17 = uVar15 + 1;
      } while (Found[uVar15 + 1] != false);
      bVar22 = false;
      uVar17 = (ulong)((int)uVar15 + 1);
    }
    if (!bVar22) {
      SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                ((SmallVectorTemplateBase<llvm::StringRef,_true> *)&Components,&CurrentComponent);
    }
LAB_001869e2:
    uVar21 = (ulong)((int)uVar21 + 1);
    do {
      uVar17 = uVar21;
      if (3 < (uint)uVar17) break;
      uVar21 = uVar17 + 1;
    } while (Found[uVar17] != false);
    uVar21 = uVar17 & 0xffffffff;
    pcVar4 = AndroidVersion.Data;
    sVar5 = AndroidVersion.Length;
    uVar6 = NormalizedEnvironment.field_2._M_local_buf[0];
    pcVar7 = Str_local.Data;
    sVar3 = Str_local.Length;
  }
LAB_00186a04:
  if ((((Components.super_SmallVectorImpl<llvm::StringRef>.
         super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
        0xffffffff) <= uVar19) ||
      (*(ulong *)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase
                        .BeginX + uVar19 * 0x10 + 8) != __n)) ||
     ((__n != 0 &&
      (iVar13 = bcmp(*(void **)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                      super_SmallVectorBase.BeginX + uVar19 * 0x10),__s1,__n),
      iVar13 != 0)))) {
    __assert_fail("Pos < Components.size() && Components[Pos] == Comp && \"Component moved wrong!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                  ,0x374,"static std::string llvm::Triple::normalize(StringRef)");
  }
  Found[uVar19] = true;
LAB_00186a4e:
  uVar19 = uVar19 + 1;
  goto LAB_0018671d;
LAB_001868ec:
  uVar20 = (uint)uVar21;
  if (lVar16 == 0) goto LAB_00186a04;
  if (uVar20 < 5) {
    uVar20 = 4;
  }
  uVar17 = uVar21 << 4 | 8;
  for (; uVar21 < 4; uVar21 = uVar21 + 1) {
    if (Found[uVar21] != true) {
      uVar20 = (uint)uVar21;
      break;
    }
    uVar17 = uVar17 + 0x10;
  }
  if (Components.super_SmallVectorImpl<llvm::StringRef>.
      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size <= uVar20)
  goto LAB_00186e63;
  uVar2 = *(undefined8 *)
           ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                  BeginX + (uVar17 - 8));
  lVar18 = *(long *)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                           super_SmallVectorBase.BeginX + uVar17);
  *(undefined8 *)
   ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
   (uVar17 - 8)) = uVar14;
  *(long *)((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                  BeginX + uVar17) = lVar16;
  uVar21 = (ulong)(uVar20 + 1);
  uVar14 = uVar2;
  lVar16 = lVar18;
  goto LAB_001868ec;
}

Assistant:

std::string Triple::normalize(StringRef Str) {
  bool IsMinGW32 = false;
  bool IsCygwin = false;

  // Parse into components.
  SmallVector<StringRef, 4> Components;
  Str.split(Components, '-');

  // If the first component corresponds to a known architecture, preferentially
  // use it for the architecture.  If the second component corresponds to a
  // known vendor, preferentially use it for the vendor, etc.  This avoids silly
  // component movement when a component parses as (eg) both a valid arch and a
  // valid os.
  ArchType Arch = UnknownArch;
  if (Components.size() > 0)
    Arch = parseArch(Components[0]);
  VendorType Vendor = UnknownVendor;
  if (Components.size() > 1)
    Vendor = parseVendor(Components[1]);
  OSType OS = UnknownOS;
  if (Components.size() > 2) {
    OS = parseOS(Components[2]);
    IsCygwin = Components[2].startswith("cygwin");
    IsMinGW32 = Components[2].startswith("mingw");
  }
  EnvironmentType Environment = UnknownEnvironment;
  if (Components.size() > 3)
    Environment = parseEnvironment(Components[3]);
  ObjectFormatType ObjectFormat = UnknownObjectFormat;
  if (Components.size() > 4)
    ObjectFormat = parseFormat(Components[4]);

  // Note which components are already in their final position.  These will not
  // be moved.
  bool Found[4];
  Found[0] = Arch != UnknownArch;
  Found[1] = Vendor != UnknownVendor;
  Found[2] = OS != UnknownOS;
  Found[3] = Environment != UnknownEnvironment;

  // If they are not there already, permute the components into their canonical
  // positions by seeing if they parse as a valid architecture, and if so moving
  // the component to the architecture position etc.
  for (unsigned Pos = 0; Pos != array_lengthof(Found); ++Pos) {
    if (Found[Pos])
      continue; // Already in the canonical position.

    for (unsigned Idx = 0; Idx != Components.size(); ++Idx) {
      // Do not reparse any components that already matched.
      if (Idx < array_lengthof(Found) && Found[Idx])
        continue;

      // Does this component parse as valid for the target position?
      bool Valid = false;
      StringRef Comp = Components[Idx];
      switch (Pos) {
      default: llvm_unreachable("unexpected component type!");
      case 0:
        Arch = parseArch(Comp);
        Valid = Arch != UnknownArch;
        break;
      case 1:
        Vendor = parseVendor(Comp);
        Valid = Vendor != UnknownVendor;
        break;
      case 2:
        OS = parseOS(Comp);
        IsCygwin = Comp.startswith("cygwin");
        IsMinGW32 = Comp.startswith("mingw");
        Valid = OS != UnknownOS || IsCygwin || IsMinGW32;
        break;
      case 3:
        Environment = parseEnvironment(Comp);
        Valid = Environment != UnknownEnvironment;
        if (!Valid) {
          ObjectFormat = parseFormat(Comp);
          Valid = ObjectFormat != UnknownObjectFormat;
        }
        break;
      }
      if (!Valid)
        continue; // Nope, try the next component.

      // Move the component to the target position, pushing any non-fixed
      // components that are in the way to the right.  This tends to give
      // good results in the common cases of a forgotten vendor component
      // or a wrongly positioned environment.
      if (Pos < Idx) {
        // Insert left, pushing the existing components to the right.  For
        // example, a-b-i386 -> i386-a-b when moving i386 to the front.
        StringRef CurrentComponent(""); // The empty component.
        // Replace the component we are moving with an empty component.
        std::swap(CurrentComponent, Components[Idx]);
        // Insert the component being moved at Pos, displacing any existing
        // components to the right.
        for (unsigned i = Pos; !CurrentComponent.empty(); ++i) {
          // Skip over any fixed components.
          while (i < array_lengthof(Found) && Found[i])
            ++i;
          // Place the component at the new position, getting the component
          // that was at this position - it will be moved right.
          std::swap(CurrentComponent, Components[i]);
        }
      } else if (Pos > Idx) {
        // Push right by inserting empty components until the component at Idx
        // reaches the target position Pos.  For example, pc-a -> -pc-a when
        // moving pc to the second position.
        do {
          // Insert one empty component at Idx.
          StringRef CurrentComponent(""); // The empty component.
          for (unsigned i = Idx; i < Components.size();) {
            // Place the component at the new position, getting the component
            // that was at this position - it will be moved right.
            std::swap(CurrentComponent, Components[i]);
            // If it was placed on top of an empty component then we are done.
            if (CurrentComponent.empty())
              break;
            // Advance to the next component, skipping any fixed components.
            while (++i < array_lengthof(Found) && Found[i])
              ;
          }
          // The last component was pushed off the end - append it.
          if (!CurrentComponent.empty())
            Components.push_back(CurrentComponent);

          // Advance Idx to the component's new position.
          while (++Idx < array_lengthof(Found) && Found[Idx])
            ;
        } while (Idx < Pos); // Add more until the final position is reached.
      }
      assert(Pos < Components.size() && Components[Pos] == Comp &&
             "Component moved wrong!");
      Found[Pos] = true;
      break;
    }
  }

  // Special case logic goes here.  At this point Arch, Vendor and OS have the
  // correct values for the computed components.
  std::string NormalizedEnvironment;
  if (Environment == Triple::Android && Components[3].startswith("androideabi")) {
    StringRef AndroidVersion = Components[3].drop_front(strlen("androideabi"));
    if (AndroidVersion.empty()) {
      Components[3] = "android";
    } else {
      NormalizedEnvironment = Twine("android", AndroidVersion).str();
      Components[3] = NormalizedEnvironment;
    }
  }

  // SUSE uses "gnueabi" to mean "gnueabihf"
  if (Vendor == Triple::SUSE && Environment == llvm::Triple::GNUEABI)
    Components[3] = "gnueabihf";

  if (OS == Triple::Win32) {
    Components.resize(4);
    Components[2] = "windows";
    if (Environment == UnknownEnvironment) {
      if (ObjectFormat == UnknownObjectFormat || ObjectFormat == Triple::COFF)
        Components[3] = "msvc";
      else
        Components[3] = getObjectFormatTypeName(ObjectFormat);
    }
  } else if (IsMinGW32) {
    Components.resize(4);
    Components[2] = "windows";
    Components[3] = "gnu";
  } else if (IsCygwin) {
    Components.resize(4);
    Components[2] = "windows";
    Components[3] = "cygnus";
  }
  if (IsMinGW32 || IsCygwin ||
      (OS == Triple::Win32 && Environment != UnknownEnvironment)) {
    if (ObjectFormat != UnknownObjectFormat && ObjectFormat != Triple::COFF) {
      Components.resize(5);
      Components[4] = getObjectFormatTypeName(ObjectFormat);
    }
  }

  // Stick the corrected components back together to form the normalized string.
  std::string Normalized;
  for (unsigned i = 0, e = Components.size(); i != e; ++i) {
    if (i) Normalized += '-';
    Normalized += Components[i];
  }
  return Normalized;
}